

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

void __thiscall crnlib::spinlock::unlock(spinlock *this)

{
  int iVar1;
  
  iVar1 = pthread_spin_unlock(&this->m_spinlock);
  if (iVar1 != 0) {
    crnlib_fail("\"spinlock: pthread_spin_unlock() failed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_threading_pthreads.cpp"
                ,0xe3);
    return;
  }
  return;
}

Assistant:

void spinlock::unlock() {
#if !defined(__APPLE__)
  if (pthread_spin_unlock(&m_spinlock)) {
    CRNLIB_FAIL("spinlock: pthread_spin_unlock() failed");
  }
#else
  os_unfair_lock_unlock(m_lock);
#endif
}